

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printChannelList(ChannelList *cl)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  
  p_Var1 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  while( true ) {
    p_Var2 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var1 == p_Var2) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"\n    ");
    poVar3 = std::operator<<(poVar3,(char *)(p_Var1 + 1));
    std::operator<<(poVar3,", ");
    printPixelType(p_Var1[9]._M_color);
    poVar3 = std::operator<<((ostream *)&std::cout,", sampling ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var1[9].field_0x4);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,*(int *)&p_Var1[9]._M_parent);
    if (*(char *)((long)&p_Var1[9]._M_parent + 4) == '\x01') {
      std::operator<<((ostream *)&std::cout,", plinear");
    }
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return;
}

Assistant:

void
printChannelList (const ChannelList& cl)
{
    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
    {
        cout << "\n    " << i.name () << ", ";

        printPixelType (i.channel ().type);

        cout << ", sampling " << i.channel ().xSampling << " "
             << i.channel ().ySampling;

        if (i.channel ().pLinear) cout << ", plinear";
    }
}